

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::VertexAttributeBindingStateQueryTests::init
          (VertexAttributeBindingStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  QueryType QVar1;
  Context *pCVar2;
  char *__rhs;
  pointer __rhs_00;
  VertexAttributeBindingStateQueryTests *pVVar3;
  AttributeCase *pAVar4;
  int extraout_EAX;
  TestCaseGroup *pTVar5;
  IndexedCase *pIVar6;
  long lVar7;
  allocator<char> local_99;
  TestCaseGroup *local_98;
  VertexAttributeBindingStateQueryTests *local_90;
  AttributeCase *local_88;
  TestCaseGroup *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_98,(this->super_TestCaseGroup).m_context,"vertex_attrib","Vertex attribute state"
            );
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).m_context,"indexed","Indexed state");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_98);
  local_80 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  lVar7 = 0;
  local_90 = this;
  while (pVVar3 = local_90, lVar7 != 0x40) {
    local_88 = (AttributeCase *)operator_new(0x80);
    pCVar2 = (pVVar3->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"vertex_attrib_binding",&local_99);
    __rhs = *(char **)((long)&init::verifiers[0].suffix + lVar7);
    std::operator+(&local_78,&local_50,__rhs);
    pAVar4 = local_88;
    QVar1 = *(QueryType *)((long)&init::verifiers[0].type + lVar7);
    local_58 = lVar7;
    anon_unknown_1::AttributeCase::AttributeCase
              (local_88,pCVar2,local_78._M_dataplus._M_p,"Test VERTEX_ATTRIB_BINDING",QVar1);
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e52cf8;
    tcu::TestNode::addChild((TestNode *)local_98,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    local_88 = (AttributeCase *)operator_new(0x80);
    pCVar2 = (local_90->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"vertex_attrib_relative_offset",&local_99);
    std::operator+(&local_78,&local_50,__rhs);
    pAVar4 = local_88;
    anon_unknown_1::AttributeCase::AttributeCase
              (local_88,pCVar2,local_78._M_dataplus._M_p,"Test VERTEX_ATTRIB_RELATIVE_OFFSET",QVar1)
    ;
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e52da8;
    tcu::TestNode::addChild((TestNode *)local_98,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    lVar7 = local_58 + 0x10;
  }
  pTVar5 = (TestCaseGroup *)0x8;
  while( true ) {
    pVVar3 = local_90;
    pIVar6 = (IndexedCase *)operator_new(0x80);
    pCVar2 = (pVVar3->super_TestCaseGroup).m_context;
    if (pTVar5 == (TestCaseGroup *)&DAT_00000038) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"vertex_binding_divisor_",&local_99);
    __rhs_00 = pTVar5[0x40b09].super_TestCaseGroup.super_TestNode.m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::operator+(&local_78,&local_50,(char *)__rhs_00);
    QVar1 = *(QueryType *)
             &pTVar5[0x40b09].super_TestCaseGroup.super_TestNode.m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_98 = pTVar5;
    anon_unknown_1::IndexedCase::IndexedCase
              (pIVar6,pCVar2,local_78._M_dataplus._M_p,"Test VERTEX_BINDING_DIVISOR",QVar1);
    (pIVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e52e00;
    tcu::TestNode::addChild((TestNode *)local_80,(TestNode *)pIVar6);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    pIVar6 = (IndexedCase *)operator_new(0x80);
    pCVar2 = (local_90->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"vertex_binding_offset_",&local_99);
    std::operator+(&local_78,&local_50,(char *)__rhs_00);
    anon_unknown_1::IndexedCase::IndexedCase
              (pIVar6,pCVar2,local_78._M_dataplus._M_p,"Test VERTEX_BINDING_OFFSET",QVar1);
    (pIVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e52eb0;
    tcu::TestNode::addChild((TestNode *)local_80,(TestNode *)pIVar6);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    pIVar6 = (IndexedCase *)operator_new(0x80);
    pCVar2 = (local_90->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"vertex_binding_stride_",&local_99);
    std::operator+(&local_78,&local_50,(char *)__rhs_00);
    anon_unknown_1::IndexedCase::IndexedCase
              (pIVar6,pCVar2,local_78._M_dataplus._M_p,"Test VERTEX_BINDING_STRIDE",QVar1);
    (pIVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e52f08;
    tcu::TestNode::addChild((TestNode *)local_80,(TestNode *)pIVar6);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    pIVar6 = (IndexedCase *)operator_new(0x80);
    pCVar2 = (local_90->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"vertex_binding_buffer_",&local_99);
    std::operator+(&local_78,&local_50,(char *)__rhs_00);
    anon_unknown_1::IndexedCase::IndexedCase
              (pIVar6,pCVar2,local_78._M_dataplus._M_p,"Test VERTEX_BINDING_BUFFER",QVar1);
    (pIVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e52f60;
    tcu::TestNode::addChild((TestNode *)local_80,(TestNode *)pIVar6);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    pTVar5 = (TestCaseGroup *)&(local_98->super_TestCaseGroup).super_TestNode.m_name;
  }
  anon_unknown_1::IndexedCase::IndexedCase
            (pIVar6,pCVar2,"vertex_binding_divisor_mixed","Test VERTEX_BINDING_DIVISOR",
             QUERY_INDEXED_INTEGER);
  pTVar5 = local_80;
  (pIVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e52fb8;
  tcu::TestNode::addChild((TestNode *)local_80,(TestNode *)pIVar6);
  pIVar6 = (IndexedCase *)operator_new(0x80);
  anon_unknown_1::IndexedCase::IndexedCase
            (pIVar6,(pVVar3->super_TestCaseGroup).m_context,"vertex_binding_offset_mixed",
             "Test VERTEX_BINDING_OFFSET",QUERY_INDEXED_INTEGER);
  (pIVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e53010;
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pIVar6);
  pIVar6 = (IndexedCase *)operator_new(0x80);
  anon_unknown_1::IndexedCase::IndexedCase
            (pIVar6,(pVVar3->super_TestCaseGroup).m_context,"vertex_binding_stride_mixed",
             "Test VERTEX_BINDING_STRIDE",QUERY_INDEXED_INTEGER);
  (pIVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e53068;
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pIVar6);
  pIVar6 = (IndexedCase *)operator_new(0x80);
  anon_unknown_1::IndexedCase::IndexedCase
            (pIVar6,(pVVar3->super_TestCaseGroup).m_context,"vertex_binding_buffer_mixed",
             "Test VERTEX_BINDING_BUFFER",QUERY_INDEXED_INTEGER);
  (pIVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e530c0;
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pIVar6);
  return extraout_EAX;
}

Assistant:

void VertexAttributeBindingStateQueryTests::init (void)
{
	tcu::TestCaseGroup* const attributeGroup	= new TestCaseGroup(m_context, "vertex_attrib", "Vertex attribute state");
	tcu::TestCaseGroup* const indexedGroup		= new TestCaseGroup(m_context, "indexed", "Indexed state");

	addChild(attributeGroup);
	addChild(indexedGroup);

	// .vertex_attrib
	{
		static const struct Verifier
		{
			const char*		suffix;
			QueryType		type;
		} verifiers[] =
		{
			{ "",						QUERY_ATTRIBUTE_INTEGER					},	// avoid renaming tests
			{ "_getvertexattribfv",		QUERY_ATTRIBUTE_FLOAT					},
			{ "_getvertexattribiiv",	QUERY_ATTRIBUTE_PURE_INTEGER			},
			{ "_getvertexattribiuiv",	QUERY_ATTRIBUTE_PURE_UNSIGNED_INTEGER	},
		};

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
		{
			attributeGroup->addChild(new AttributeBindingCase		(m_context,	(std::string("vertex_attrib_binding") + verifiers[verifierNdx].suffix).c_str(),			"Test VERTEX_ATTRIB_BINDING",			verifiers[verifierNdx].type));
			attributeGroup->addChild(new AttributeRelativeOffsetCase(m_context,	(std::string("vertex_attrib_relative_offset") + verifiers[verifierNdx].suffix).c_str(),	"Test VERTEX_ATTRIB_RELATIVE_OFFSET",	verifiers[verifierNdx].type));
		}
	}

	// .indexed
	{
		static const struct Verifier
		{
			const char*		name;
			QueryType		type;
		} verifiers[] =
		{
			{ "getintegeri",	QUERY_INDEXED_INTEGER	},
			{ "getintegeri64",	QUERY_INDEXED_INTEGER64	},
			{ "getboolean",		QUERY_INDEXED_BOOLEAN	},
		};

		// states

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
		{
			indexedGroup->addChild(new VertexBindingDivisorCase	(m_context, (std::string("vertex_binding_divisor_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_DIVISOR",	verifiers[verifierNdx].type));
			indexedGroup->addChild(new VertexBindingOffsetCase	(m_context, (std::string("vertex_binding_offset_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_OFFSET",	verifiers[verifierNdx].type));
			indexedGroup->addChild(new VertexBindingStrideCase	(m_context, (std::string("vertex_binding_stride_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_STRIDE",	verifiers[verifierNdx].type));
			indexedGroup->addChild(new VertexBindingBufferCase	(m_context, (std::string("vertex_binding_buffer_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_BUFFER",	verifiers[verifierNdx].type));
		}

		// mixed apis

		indexedGroup->addChild(new MixedVertexBindingDivisorCase(m_context, "vertex_binding_divisor_mixed",	"Test VERTEX_BINDING_DIVISOR"));
		indexedGroup->addChild(new MixedVertexBindingOffsetCase	(m_context, "vertex_binding_offset_mixed",	"Test VERTEX_BINDING_OFFSET"));
		indexedGroup->addChild(new MixedVertexBindingStrideCase	(m_context, "vertex_binding_stride_mixed",	"Test VERTEX_BINDING_STRIDE"));
		indexedGroup->addChild(new MixedVertexBindingBufferCase	(m_context, "vertex_binding_buffer_mixed",	"Test VERTEX_BINDING_BUFFER"));
	}
}